

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileExecutableTargetGenerator::WriteNvidiaDeviceExecutableRule
          (cmMakefileExecutableTargetGenerator *this,bool relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,string *targetOutput)

{
  bool linkScriptShell;
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmMakefile *this_00;
  cmLinkLineComputer *pcVar3;
  bool useResponseFile;
  bool forResponse;
  string *psVar4;
  string *relDir;
  undefined7 in_register_00000031;
  char *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *real_link_command;
  pointer b;
  string_view source;
  string_view source_00;
  string_view source_01;
  allocator<char> local_412;
  allocator<char> local_411;
  cmLinkLineComputer *local_410;
  undefined4 local_404;
  string *local_400;
  string targetFullPathCompilePDB;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  string local_3b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exeCleanFiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmList real_link_commands;
  string targetOutPathCompilePDB;
  string linkLanguage;
  string local_308;
  string linkFlags;
  string target;
  string objectDir;
  string val;
  string launcher;
  string buildObjs;
  string linkLibs;
  string langFlags;
  string ignored_;
  string linkRule;
  string linkRuleVar;
  RuleVariables vars;
  
  local_404 = (undefined4)CONCAT71(in_register_00000031,relink);
  local_400 = targetOutput;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkLanguage,"CUDA",(allocator<char> *)&vars);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefileTargetGenerator::AppendLinkDepends
            (&this->super_cmMakefileTargetGenerator,&depends,&linkLanguage);
  langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
  langFlags._M_string_length = 0;
  langFlags.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)&vars,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)pcVar2,&langFlags,pcVar1,&linkLanguage,(string *)&vars);
  std::__cxx11::string::~string((string *)&vars);
  exeCleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  exeCleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  exeCleanFiles.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmOutputConverter::MaybeRelativeToCurBinDir
            ((string *)&vars,
             (cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,local_400);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&exeCleanFiles,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
  std::__cxx11::string::~string((string *)&vars);
  linkScriptShell =
       (((this->super_cmMakefileTargetGenerator).GlobalGenerator)->super_cmGlobalCommonGenerator).
       super_cmGlobalGenerator.UseLinkScript;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkRuleVar,"CMAKE_CUDA_DEVICE_LINK_EXECUTABLE",(allocator<char> *)&vars);
  cmMakefileTargetGenerator::GetLinkRule
            (&linkRule,&this->super_cmMakefileTargetGenerator,&linkRuleVar);
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmList::cmList(&real_link_commands,&linkRule,Yes,No);
  useResponseFile =
       cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                 (&this->super_cmMakefileTargetGenerator,&linkLanguage);
  forResponse = cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                          (&this->super_cmMakefileTargetGenerator,&linkLanguage);
  cmOutputConverter::SetLinkScriptShell
            ((cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
             linkScriptShell);
  local_410 = (cmLinkLineComputer *)operator_new(0x40);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&linkFlags,(cmLocalGenerator *)pcVar2);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&vars,(cmStateSnapshot *)&linkFlags);
  cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
            ((cmLinkLineDeviceComputer *)local_410,(cmOutputConverter *)pcVar2,
             (cmStateDirectory *)&vars);
  pcVar3 = local_410;
  cmLinkLineComputer::SetForResponse(local_410,forResponse);
  cmLinkLineComputer::SetRelink(pcVar3,(bool)(char)local_404);
  linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
  linkFlags._M_string_length = 0;
  ignored_._M_dataplus._M_p = (pointer)&ignored_.field_2;
  ignored_._M_string_length = 0;
  linkFlags.field_2._M_local_buf[0] = '\0';
  ignored_.field_2._M_local_buf[0] = '\0';
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)&vars,&this->super_cmMakefileTargetGenerator);
  pcVar3 = local_410;
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)pcVar2,(cmLinkLineDeviceComputer *)local_410,(string *)&vars,
             &ignored_,&linkFlags,&ignored_,&ignored_,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  std::__cxx11::string::~string((string *)&vars);
  linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
  linkLibs._M_string_length = 0;
  linkLibs.field_2._M_local_buf[0] = '\0';
  cmMakefileTargetGenerator::CreateLinkLibs
            (&this->super_cmMakefileTargetGenerator,pcVar3,&linkLibs,forResponse,&depends,
             &linkLanguage,DeviceLink);
  buildObjs._M_dataplus._M_p = (pointer)&buildObjs.field_2;
  buildObjs._M_string_length = 0;
  buildObjs.field_2._M_local_buf[0] = '\0';
  cmMakefileTargetGenerator::CreateObjectLists
            (&this->super_cmMakefileTargetGenerator,linkScriptShell,false,useResponseFile,&buildObjs
             ,&depends,false,&linkLanguage,DeviceLink);
  memset(&vars,0,0x158);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&objectDir,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmOutputConverter::MaybeRelativeToCurBinDir
            (&targetFullPathCompilePDB,(cmOutputConverter *)pcVar2,&objectDir);
  source._M_str = targetFullPathCompilePDB._M_dataplus._M_p;
  source._M_len = targetFullPathCompilePDB._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&target,(cmOutputConverter *)pcVar2,source,SHELL,false);
  std::__cxx11::string::operator=((string *)&objectDir,(string *)&target);
  std::__cxx11::string::~string((string *)&target);
  std::__cxx11::string::~string((string *)&targetFullPathCompilePDB);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  cmOutputConverter::MaybeRelativeToCurBinDir
            (&targetFullPathCompilePDB,(cmOutputConverter *)pcVar2,local_400);
  source_00._M_str = targetFullPathCompilePDB._M_dataplus._M_p;
  source_00._M_len = targetFullPathCompilePDB._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&target,(cmOutputConverter *)pcVar2,source_00,SHELL,false);
  std::__cxx11::string::~string((string *)&targetFullPathCompilePDB);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&targetOutPathCompilePDB,&this->super_cmMakefileTargetGenerator);
  cmCommonTargetGenerator::ComputeTargetCompilePDB
            (&targetFullPathCompilePDB,(cmCommonTargetGenerator *)this,&targetOutPathCompilePDB);
  std::__cxx11::string::~string((string *)&targetOutPathCompilePDB);
  source_01._M_str = targetFullPathCompilePDB._M_dataplus._M_p;
  source_01._M_len = targetFullPathCompilePDB._M_string_length;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&targetOutPathCompilePDB,
             (cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,source_01,
             SHELL,false);
  vars.Language = linkLanguage._M_dataplus._M_p;
  vars.Objects = buildObjs._M_dataplus._M_p;
  vars.ObjectDir = objectDir._M_dataplus._M_p;
  vars.Target = target._M_dataplus._M_p;
  vars.LinkLibraries = linkLibs._M_dataplus._M_p;
  vars.LanguageCompileFlags = langFlags._M_dataplus._M_p;
  vars.LinkFlags = linkFlags._M_dataplus._M_p;
  launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
  launcher._M_string_length = 0;
  vars.TargetCompilePDB = targetOutPathCompilePDB._M_dataplus._M_p;
  launcher.field_2._M_local_buf[0] = '\0';
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"RULE_LAUNCH_LINK",&local_411);
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"CMAKE_BUILD_TYPE",&local_412);
  psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_3b8);
  cmLocalGenerator::GetRuleLauncher(&val,(cmLocalGenerator *)pcVar2,pcVar1,&local_308,psVar4);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_308);
  if (val._M_string_length != 0) {
    local_3b8._M_dataplus._M_p._0_1_ = 0x20;
    cmStrCat<std::__cxx11::string&,char>(&local_308,&val,(char *)&local_3b8);
    std::__cxx11::string::operator=((string *)&launcher,(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
  }
  (*(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
    super_cmLocalGenerator.super_cmOutputConverter._vptr_cmOutputConverter[6])(&local_3b8);
  std::__cxx11::string::_M_assign
            ((string *)
             (CONCAT71(local_3b8._M_dataplus._M_p._1_7_,local_3b8._M_dataplus._M_p._0_1_) + 8));
  for (b = real_link_commands.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      b != real_link_commands.Values.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; b = b + 1) {
    cmStrCat<std::__cxx11::string&,std::__cxx11::string&>(&local_308,&launcher,b);
    std::__cxx11::string::operator=((string *)b,(string *)&local_308);
    std::__cxx11::string::~string((string *)&local_308);
    cmRulePlaceholderExpander::ExpandRuleVariables
              ((cmRulePlaceholderExpander *)
               CONCAT71(local_3b8._M_dataplus._M_p._1_7_,local_3b8._M_dataplus._M_p._0_1_),
               (cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,b,&vars);
  }
  cmOutputConverter::SetLinkScriptShell
            ((cmOutputConverter *)(this->super_cmMakefileTargetGenerator).LocalGenerator,false);
  if ((long *)CONCAT71(local_3b8._M_dataplus._M_p._1_7_,local_3b8._M_dataplus._M_p._0_1_) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_3b8._M_dataplus._M_p._1_7_,local_3b8._M_dataplus._M_p._0_1_
                                  ) + 8))();
  }
  std::__cxx11::string::~string((string *)&val);
  std::__cxx11::string::~string((string *)&launcher);
  std::__cxx11::string::~string((string *)&targetOutPathCompilePDB);
  std::__cxx11::string::~string((string *)&targetFullPathCompilePDB);
  std::__cxx11::string::~string((string *)&target);
  std::__cxx11::string::~string((string *)&objectDir);
  std::__cxx11::string::~string((string *)&buildObjs);
  std::__cxx11::string::~string((string *)&linkLibs);
  std::__cxx11::string::~string((string *)&ignored_);
  std::__cxx11::string::~string((string *)&linkFlags);
  (*local_410->_vptr_cmLinkLineComputer[1])();
  if (linkScriptShell == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&commands1,&real_link_commands.Values);
  }
  else {
    name = "dlink.txt";
    if ((char)local_404 != '\0') {
      name = "drelink.txt";
    }
    cmMakefileTargetGenerator::CreateLinkScript
              (&this->super_cmMakefileTargetGenerator,name,&real_link_commands.Values,&commands1,
               &depends);
  }
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar4 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile
                     );
  relDir = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmLocalUnixMakefileGenerator3::CreateCDCommand(pcVar2,&commands1,psVar4,relDir);
  ::cm::
  append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
            (commands,&commands1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&commands1);
  cmLocalUnixMakefileGenerator3::WriteMakeRule
            ((this->super_cmMakefileTargetGenerator).LocalGenerator,
             (ostream *)
             (this->super_cmMakefileTargetGenerator).BuildFileStream._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,(char *)0x0,
             local_400,&depends,commands,false,false);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::
  _M_insert_range_unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&(this->super_cmMakefileTargetGenerator).CleanFiles,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )exeCleanFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )exeCleanFiles.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&real_link_commands.Values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands1);
  std::__cxx11::string::~string((string *)&linkRule);
  std::__cxx11::string::~string((string *)&linkRuleVar);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&exeCleanFiles);
  std::__cxx11::string::~string((string *)&langFlags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::__cxx11::string::~string((string *)&linkLanguage);
  return;
}

Assistant:

void cmMakefileExecutableTargetGenerator::WriteNvidiaDeviceExecutableRule(
  bool relink, std::vector<std::string>& commands,
  const std::string& targetOutput)
{
  const std::string linkLanguage = "CUDA";

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends, linkLanguage);

  // Add language feature flags.
  std::string langFlags;
  this->LocalGenerator->AddLanguageFlagsForLinking(
    langFlags, this->GeneratorTarget, linkLanguage, this->GetConfigName());

  // Construct a list of files associated with this executable that
  // may need to be cleaned.
  std::vector<std::string> exeCleanFiles;
  exeCleanFiles.push_back(
    this->LocalGenerator->MaybeRelativeToCurBinDir(targetOutput));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  // Construct the main link rule.
  const std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_EXECUTABLE";
  const std::string linkRule = this->GetLinkRule(linkRuleVar);
  std::vector<std::string> commands1;
  cmList real_link_commands(linkRule);

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  // Expand the rule variables.
  {
    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    std::unique_ptr<cmLinkLineDeviceComputer> linkLineComputer(
      new cmLinkLineDeviceComputer(
        this->LocalGenerator,
        this->LocalGenerator->GetStateSnapshot().GetDirectory()));
    linkLineComputer->SetForResponse(useResponseFileForLibs);
    linkLineComputer->SetRelink(relink);

    // Create set of linking flags.
    std::string linkFlags;
    std::string ignored_;
    this->LocalGenerator->GetDeviceLinkFlags(
      *linkLineComputer, this->GetConfigName(), ignored_, linkFlags, ignored_,
      ignored_, this->GeneratorTarget);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    this->CreateLinkLibs(
      linkLineComputer.get(), linkLibs, useResponseFileForLibs, depends,
      linkLanguage, cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink);

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(
      useLinkScript, false, useResponseFileForObjects, buildObjs, depends,
      false, linkLanguage,
      cmMakefileTargetGenerator::ResponseFlagFor::DeviceLink);

    cmRulePlaceholderExpander::RuleVariables vars;
    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();

    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(objectDir),
      cmOutputConverter::SHELL);

    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(targetOutput),
      cmOutputConverter::SHELL);

    std::string targetFullPathCompilePDB =
      this->ComputeTargetCompilePDB(this->GetConfigName());
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Language = linkLanguage.c_str();
    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.LanguageCompileFlags = langFlags.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    std::string launcher;

    std::string val = this->LocalGenerator->GetRuleLauncher(
      this->GeneratorTarget, "RULE_LAUNCH_LINK",
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    if (cmNonempty(val)) {
      launcher = cmStrCat(val, ' ');
    }

    auto rulePlaceholderExpander =
      this->LocalGenerator->CreateRulePlaceholderExpander();

    // Expand placeholders in the commands.
    rulePlaceholderExpander->SetTargetImpLib(targetOutput);
    for (auto& real_link_command : real_link_commands) {
      real_link_command = cmStrCat(launcher, real_link_command);
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator,
                                                   real_link_command, vars);
    }

    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);
  }

  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  cm::append(commands, commands1);
  commands1.clear();

  // Write the build rule.
  this->LocalGenerator->WriteMakeRule(*this->BuildFileStream, nullptr,
                                      targetOutput, depends, commands, false);

  // Clean all the possible executable names and symlinks.
  this->CleanFiles.insert(exeCleanFiles.begin(), exeCleanFiles.end());
}